

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_context.cpp
# Opt level: O0

void __thiscall
ConfidentialTransactionContext_SetAssetIssuanceTest2_Test::TestBody
          (ConfidentialTransactionContext_SetAssetIssuanceTest2_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *rhs;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  IssuanceOutputParameter token_output;
  IssuanceOutputParameter issue_output;
  IssuanceParameter param;
  bool is_blind;
  ByteData256 contract_hash;
  Address asset_address;
  Amount token_amount;
  Amount asset_amount;
  Txid txid;
  ConfidentialTransactionContext tx;
  ConfidentialTransactionContext expect_tx;
  ConfidentialTransactionContext tx_base;
  IssuanceParameter *pIVar3;
  uint in_stack_fffffffffffff220;
  undefined4 in_stack_fffffffffffff224;
  vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>
  *in_stack_fffffffffffff230;
  IssuanceOutputParameter *in_stack_fffffffffffff240;
  AssertHelper local_d80;
  Message local_d78;
  string local_d70 [32];
  AssertionResult local_d50;
  AssertHelper local_d40;
  Message local_d38;
  string local_d30 [32];
  string local_d10 [32];
  AssertionResult local_cf0;
  AssertHelper local_ce0;
  Message local_cd8 [2];
  undefined1 local_cc8 [152];
  IssuanceParameter local_c30 [7];
  IssuanceOutputParameter local_8b8;
  byte local_4c9;
  ByteData256 local_4c8;
  vector local_4b0 [31];
  allocator local_491;
  string local_490 [32];
  Address local_470 [376];
  Amount local_2f8 [16];
  Amount local_2e8 [23];
  allocator local_2d1;
  string local_2d0 [32];
  Txid local_2b0;
  ConfidentialTransactionContext local_290 [191];
  allocator local_1d1;
  string local_1d0 [32];
  ConfidentialTransactionContext local_1b0 [207];
  allocator local_e1;
  string local_e0 [32];
  ConfidentialTransactionContext local_c0 [192];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_e0,
             "020000000001fa8f7f752deb920f5d94331e880c2f514016c58663496ff33cc9c2368adec3880000000000ffffffff020151f799a22a9375b31c2f20edce025f0df5231306e81222a0061bde342dc447ef01000000003b9328e00017a9149d4a252d04e5072497ef2ac59574b1b14a7831b18701f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f01000000000007a120000000000000"
             ,&local_e1);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(local_c0,local_e0);
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_1d0,
             "020000000001fa8f7f752deb920f5d94331e880c2f514016c58663496ff33cc9c2368adec3880000008000ffffffff0000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000001000000001dcd6500010000000000000000030151f799a22a9375b31c2f20edce025f0df5231306e81222a0061bde342dc447ef01000000003b9328e00017a9149d4a252d04e5072497ef2ac59574b1b14a7831b18701f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f01000000000007a1200000019768c01041eb448973f1870c4d9cef5f2b3d883b5844ee3579bb8e52771bcbf301000000001dcd6500001976a9148bba9241b14f785130e7ff186901997a5a1cc65688ac00000000"
             ,&local_1d1);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(local_1b0,local_1d0);
  std::__cxx11::string::~string(local_1d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1d1);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(local_290,local_c0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_2d0,"88c3de8a36c2c93cf36f496386c51640512f0c881e33945d0f92eb2d757f8ffa",&local_2d1
            );
  cfd::core::Txid::Txid(&local_2b0,local_2d0);
  std::__cxx11::string::~string(local_2d0);
  std::allocator<char>::~allocator((allocator<char> *)&local_2d1);
  cfd::core::Amount::Amount(local_2e8,500000000);
  cfd::core::Amount::Amount(local_2f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_490,"2dnAZpPK76YhzKRcqMv4iBkLcMF4gP6aJ32",&local_491);
  cfd::core::GetElementsAddressFormatList();
  cfd::core::Address::Address(local_470,local_490,local_4b0);
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (in_stack_fffffffffffff230);
  std::__cxx11::string::~string(local_490);
  std::allocator<char>::~allocator((allocator<char> *)&local_491);
  cfd::core::ByteData256::ByteData256(&local_4c8);
  local_4c9 = 0;
  cfd::core::IssuanceParameter::IssuanceParameter((IssuanceParameter *)in_stack_fffffffffffff240);
  cfd::IssuanceOutputParameter::IssuanceOutputParameter(in_stack_fffffffffffff240);
  cfd::IssuanceOutputParameter::IssuanceOutputParameter(in_stack_fffffffffffff240);
  cfd::core::Address::operator=(&local_8b8.address,local_470);
  local_8b8._872_1_ = local_2e8[8];
  local_8b8.amount = local_2e8[0];
  local_8b8._865_1_ = local_2e8[1];
  local_8b8._866_1_ = local_2e8[2];
  local_8b8._867_1_ = local_2e8[3];
  local_8b8._868_1_ = local_2e8[4];
  local_8b8._869_1_ = local_2e8[5];
  local_8b8._870_1_ = local_2e8[6];
  local_8b8._871_1_ = local_2e8[7];
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint((OutPoint *)local_cc8,&local_2b0,0);
      in_stack_fffffffffffff220 = local_4c9 & 1;
      pIVar3 = local_c30;
      cfd::ConfidentialTransactionContext::SetAssetIssuance
                ((OutPoint *)(local_cc8 + 0x28),(Amount *)local_290,
                 (IssuanceOutputParameter *)local_cc8,local_2e8,&local_8b8,SUB81(local_2f8,0),
                 (ByteData256 *)pIVar3);
      cfd::core::IssuanceParameter::operator=
                ((IssuanceParameter *)CONCAT44(in_stack_fffffffffffff224,in_stack_fffffffffffff220),
                 pIVar3);
      cfd::core::IssuanceParameter::~IssuanceParameter
                ((IssuanceParameter *)CONCAT44(in_stack_fffffffffffff224,in_stack_fffffffffffff220))
      ;
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x1d6e97);
    }
  }
  else {
    testing::Message::Message(local_cd8);
    testing::internal::AssertHelper::AssertHelper
              (&local_ce0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0xca,
               "Expected: (param = tx.SetAssetIssuance(OutPoint(txid, 0), asset_amount, issue_output, token_amount, token_output, is_blind, contract_hash)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_ce0,local_cd8);
    testing::internal::AssertHelper::~AssertHelper(&local_ce0);
    testing::Message::~Message((Message *)0x1d717d);
  }
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_();
  rhs = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_cf0,"tx.GetHex().c_str()","expect_tx.GetHex().c_str()",pcVar2,rhs);
  std::__cxx11::string::~string(local_d30);
  std::__cxx11::string::~string(local_d10);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_cf0);
  if (!bVar1) {
    testing::Message::Message(&local_d38);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x1d72f4);
    testing::internal::AssertHelper::AssertHelper
              (&local_d40,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0xcb,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d40,&local_d38);
    testing::internal::AssertHelper::~AssertHelper(&local_d40);
    testing::Message::~Message((Message *)0x1d7351);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d73a6);
  cfd::core::BlindFactor::GetHex_abi_cxx11_();
  pcVar2 = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_d50,"param.entropy.GetHex().c_str()",
             "\"c933a36fc6fbc1ccc50a8c73dbb7711b9958f3b1367c94ac3d3cae495aaf311f\"",pcVar2,
             "c933a36fc6fbc1ccc50a8c73dbb7711b9958f3b1367c94ac3d3cae495aaf311f");
  std::__cxx11::string::~string(local_d70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_d50);
  if (!bVar1) {
    testing::Message::Message(&local_d78);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x1d747e);
    testing::internal::AssertHelper::AssertHelper
              (&local_d80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0xce,pcVar2);
    testing::internal::AssertHelper::operator=(&local_d80,&local_d78);
    testing::internal::AssertHelper::~AssertHelper(&local_d80);
    testing::Message::~Message((Message *)0x1d74cc);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1d751e);
  cfd::IssuanceOutputParameter::~IssuanceOutputParameter
            ((IssuanceOutputParameter *)
             CONCAT44(in_stack_fffffffffffff224,in_stack_fffffffffffff220));
  cfd::IssuanceOutputParameter::~IssuanceOutputParameter
            ((IssuanceOutputParameter *)
             CONCAT44(in_stack_fffffffffffff224,in_stack_fffffffffffff220));
  cfd::core::IssuanceParameter::~IssuanceParameter
            ((IssuanceParameter *)CONCAT44(in_stack_fffffffffffff224,in_stack_fffffffffffff220));
  cfd::core::ByteData256::~ByteData256((ByteData256 *)0x1d7552);
  cfd::core::Address::~Address
            ((Address *)CONCAT44(in_stack_fffffffffffff224,in_stack_fffffffffffff220));
  cfd::core::Txid::~Txid((Txid *)0x1d756c);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)
             CONCAT44(in_stack_fffffffffffff224,in_stack_fffffffffffff220));
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)
             CONCAT44(in_stack_fffffffffffff224,in_stack_fffffffffffff220));
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)
             CONCAT44(in_stack_fffffffffffff224,in_stack_fffffffffffff220));
  return;
}

Assistant:

TEST(ConfidentialTransactionContext, SetAssetIssuanceTest2)
{
    // not token
    ConfidentialTransactionContext tx_base(
        "020000000001fa8f7f752deb920f5d94331e880c2f514016c58663496ff33cc9c2368adec3880000000000ffffffff020151f799a22a9375b31c2f20edce025f0df5231306e81222a0061bde342dc447ef01000000003b9328e00017a9149d4a252d04e5072497ef2ac59574b1b14a7831b18701f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f01000000000007a120000000000000");
    ConfidentialTransactionContext expect_tx(
        "020000000001fa8f7f752deb920f5d94331e880c2f514016c58663496ff33cc9c2368adec3880000008000ffffffff0000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000000001000000001dcd6500010000000000000000030151f799a22a9375b31c2f20edce025f0df5231306e81222a0061bde342dc447ef01000000003b9328e00017a9149d4a252d04e5072497ef2ac59574b1b14a7831b18701f38611eb688e6fcd06f25e2faf52b9f98364dc14c379ab085f1b57d56b4b1a6f01000000000007a1200000019768c01041eb448973f1870c4d9cef5f2b3d883b5844ee3579bb8e52771bcbf301000000001dcd6500001976a9148bba9241b14f785130e7ff186901997a5a1cc65688ac00000000");

    // not blind
    ConfidentialTransactionContext tx(tx_base);
    Txid txid("88c3de8a36c2c93cf36f496386c51640512f0c881e33945d0f92eb2d757f8ffa");
    Amount asset_amount = Amount(500000000);
    Amount token_amount;
    Address asset_address("2dnAZpPK76YhzKRcqMv4iBkLcMF4gP6aJ32", cfd::core::GetElementsAddressFormatList());
    ByteData256 contract_hash;
    bool is_blind = false;
    IssuanceParameter param;
    IssuanceOutputParameter issue_output;
    IssuanceOutputParameter token_output;
    issue_output.address = asset_address;
    issue_output.amount = asset_amount;
    EXPECT_NO_THROW(
        (param = tx.SetAssetIssuance(OutPoint(txid, 0), asset_amount,
                                     issue_output, token_amount,
                                     token_output, is_blind,
                                     contract_hash)));
    EXPECT_STREQ(tx.GetHex().c_str(), expect_tx.GetHex().c_str());
    EXPECT_STREQ(
        param.entropy.GetHex().c_str(),
        "c933a36fc6fbc1ccc50a8c73dbb7711b9958f3b1367c94ac3d3cae495aaf311f");
}